

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuItemColorPicker::Activate(FOptionMenuItemColorPicker *this)

{
  char *name;
  DMenu *pDVar1;
  float volume;
  DMenu *picker;
  FOptionMenuItemColorPicker *local_18;
  FOptionMenuItemColorPicker *this_local;
  
  if (this->mCVar != (FColorCVar *)0x0) {
    local_18 = this;
    FSoundID::FSoundID((FSoundID *)((long)&picker + 4),"menu/choose");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,(FSoundID *)((long)&picker + 4),volume,0.0);
    pDVar1 = DMenu::CurrentMenu;
    name = FString::operator_cast_to_char_(&(this->super_FOptionMenuItem).mLabel);
    pDVar1 = StartPickerMenu(pDVar1,name,this->mCVar);
    if (pDVar1 != (DMenu *)0x0) {
      M_ActivateMenu(pDVar1);
      return true;
    }
  }
  return false;
}

Assistant:

bool Activate()
	{
		if (mCVar != NULL)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
			DMenu *picker = StartPickerMenu(DMenu::CurrentMenu, mLabel, mCVar);
			if (picker != NULL)
			{
				M_ActivateMenu(picker);
				return true;
			}
		}
		return false;
	}